

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O3

image_u8x3_t * pjpeg_to_u8x3_baseline(pjpeg_t *pj)

{
  int iVar1;
  pjpeg_component_t *ppVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  image_u8x3_t *piVar6;
  uint8_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  uint local_64;
  
  if (pj->ncomponents != 3) {
    __assert_fail("pj->ncomponents == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pjpeg.c"
                  ,0x2e2,"image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *)");
  }
  ppVar2 = pj->components;
  uVar3 = (ulong)ppVar2->height / (ulong)ppVar2[1].height;
  uVar4 = (ulong)ppVar2->width / (ulong)ppVar2[1].width;
  uVar21 = ppVar2->height / ppVar2[2].height;
  uVar18 = ppVar2->width / ppVar2[2].width;
  piVar6 = image_u8x3_create(pj->width,pj->height);
  uVar13 = (uint)uVar3;
  uVar8 = (uint)uVar4;
  if (uVar8 == 1 && (uVar13 == 1 && (uVar18 == 1 && uVar21 == 1))) {
    uVar13 = pj->height;
    if (uVar13 != 0) {
      uVar18 = pj->width;
      uVar8 = 0;
      do {
        bVar22 = uVar18 != 0;
        uVar18 = 0;
        if (bVar22) {
          iVar11 = 0;
          uVar13 = 0;
          do {
            iVar14 = (uint)ppVar2->data[ppVar2->stride * uVar8 + uVar13] * 0x10000;
            iVar9 = ppVar2[2].data[ppVar2[2].stride * uVar8 + uVar13] - 0x80;
            uVar21 = iVar9 * 0x166e9 + iVar14 >> 0x10;
            uVar18 = uVar21;
            if (0xfe < uVar21) {
              uVar18 = 0xff;
            }
            iVar17 = ppVar2[1].data[ppVar2[1].stride * uVar8 + uVar13] - 0x80;
            uVar15 = (uint8_t)uVar18;
            if ((int)uVar21 < 0) {
              uVar15 = '\0';
            }
            piVar6->buf[(int)(piVar6->stride * uVar8 + iVar11)] = uVar15;
            uVar21 = iVar9 * -0xb6d2 + iVar17 * -0x581a + iVar14 >> 0x10;
            uVar18 = uVar21;
            if (0xfe < uVar21) {
              uVar18 = 0xff;
            }
            uVar15 = (uint8_t)uVar18;
            if ((int)uVar21 < 0) {
              uVar15 = '\0';
            }
            piVar6->buf[(long)(int)(piVar6->stride * uVar8 + iVar11) + 1] = uVar15;
            uVar21 = iVar17 * 0x1c5a2 + iVar14 >> 0x10;
            uVar18 = uVar21;
            if (0xfe < uVar21) {
              uVar18 = 0xff;
            }
            uVar15 = (uint8_t)uVar18;
            if ((int)uVar21 < 0) {
              uVar15 = '\0';
            }
            piVar6->buf[(long)(int)(piVar6->stride * uVar8 + iVar11) + 2] = uVar15;
            uVar13 = uVar13 + 1;
            uVar18 = pj->width;
            iVar11 = iVar11 + 3;
          } while (uVar13 < uVar18);
          uVar13 = pj->height;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar13);
    }
  }
  else {
    uVar20 = pj->height;
    if (uVar8 == uVar18 && uVar13 == uVar21) {
      if (uVar13 <= uVar20) {
        uVar18 = pj->width;
        local_64 = 0;
        do {
          if (uVar8 <= uVar18) {
            uVar21 = 0;
            do {
              if (0 < (int)uVar13) {
                iVar14 = ppVar2[1].data[ppVar2[1].stride * local_64 + uVar21] - 0x80;
                iVar9 = ppVar2[2].data[ppVar2[2].stride * local_64 + uVar21] - 0x80;
                iVar11 = 0;
                do {
                  if (0 < (int)uVar8) {
                    iVar19 = iVar11 + local_64 * uVar13;
                    iVar17 = 0;
                    do {
                      iVar1 = iVar17 + uVar21 * uVar8;
                      iVar10 = (uint)ppVar2->data[ppVar2->stride * iVar19 + iVar1] * 0x10000;
                      uVar20 = iVar10 + iVar9 * 0x166e9 >> 0x10;
                      uVar18 = uVar20;
                      if (0xfe < uVar20) {
                        uVar18 = 0xff;
                      }
                      uVar15 = (uint8_t)uVar18;
                      if ((int)uVar20 < 0) {
                        uVar15 = '\0';
                      }
                      iVar1 = iVar1 * 3;
                      piVar6->buf[piVar6->stride * iVar19 + iVar1] = uVar15;
                      uVar20 = iVar9 * -0xb6d2 + iVar14 * -0x581a + iVar10 >> 0x10;
                      uVar18 = uVar20;
                      if (0xfe < uVar20) {
                        uVar18 = 0xff;
                      }
                      uVar15 = (uint8_t)uVar18;
                      if ((int)uVar20 < 0) {
                        uVar15 = '\0';
                      }
                      piVar6->buf[(long)(piVar6->stride * iVar19 + iVar1) + 1] = uVar15;
                      uVar20 = iVar10 + iVar14 * 0x1c5a2 >> 0x10;
                      uVar18 = uVar20;
                      if (0xfe < uVar20) {
                        uVar18 = 0xff;
                      }
                      uVar15 = (uint8_t)uVar18;
                      if ((int)uVar20 < 0) {
                        uVar15 = '\0';
                      }
                      piVar6->buf[(long)(piVar6->stride * iVar19 + iVar1) + 2] = uVar15;
                      iVar17 = iVar17 + 1;
                    } while (iVar17 < (int)uVar8);
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 < (int)uVar13);
                uVar18 = pj->width;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < (uint)(uVar18 / uVar4));
            uVar20 = pj->height;
          }
          local_64 = local_64 + 1;
        } while (local_64 < (uint)(uVar20 / uVar3));
      }
    }
    else if (uVar20 != 0) {
      uVar5 = pj->width;
      uVar12 = 0;
      do {
        bVar22 = uVar5 != 0;
        uVar5 = 0;
        if (bVar22) {
          iVar11 = 0;
          uVar20 = 0;
          do {
            dVar23 = (double)ppVar2->data[ppVar2->stride * uVar12 + uVar20];
            dVar24 = (double)(int)(ppVar2[2].data
                                   [(int)uVar20 / (int)uVar18 +
                                    ppVar2[2].stride * ((int)uVar12 / (int)uVar21)] - 0x80);
            dVar25 = dVar24 * 1.402 + dVar23;
            if (0.0 <= dVar25) {
              uVar15 = 0xff;
              if (dVar25 <= 255.0) {
                uVar15 = (uint8_t)(int)dVar25;
              }
            }
            else {
              uVar15 = '\0';
            }
            dVar25 = (double)(int)(ppVar2[1].data
                                   [(int)uVar20 / (int)uVar8 +
                                    ppVar2[1].stride * ((int)uVar12 / (int)uVar13)] - 0x80);
            dVar24 = dVar24 * -0.71414 + dVar25 * -0.34414 + dVar23;
            if (0.0 <= dVar24) {
              uVar7 = 0xff;
              if (dVar24 <= 255.0) {
                uVar7 = (uint8_t)(int)dVar24;
              }
            }
            else {
              uVar7 = '\0';
            }
            dVar23 = dVar25 * 1.772 + dVar23;
            if (0.0 <= dVar23) {
              uVar16 = 0xff;
              if (dVar23 <= 255.0) {
                uVar16 = (uint8_t)(int)dVar23;
              }
            }
            else {
              uVar16 = '\0';
            }
            piVar6->buf[(int)(piVar6->stride * uVar12 + iVar11)] = uVar15;
            piVar6->buf[(long)(int)(piVar6->stride * uVar12 + iVar11) + 1] = uVar7;
            piVar6->buf[(long)(int)(piVar6->stride * uVar12 + iVar11) + 2] = uVar16;
            uVar20 = uVar20 + 1;
            uVar5 = pj->width;
            iVar11 = iVar11 + 3;
          } while (uVar20 < uVar5);
          uVar20 = pj->height;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar20);
    }
  }
  return piVar6;
}

Assistant:

image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *pj)
{
    assert(pj->ncomponents == 3);

    pjpeg_component_t *Y = &pj->components[0];
    pjpeg_component_t *Cb = &pj->components[1];
    pjpeg_component_t *Cr = &pj->components[2];

    int Cb_factor_y = Y->height / Cb->height;
    int Cb_factor_x = Y->width / Cb->width;

    int Cr_factor_y = Y->height / Cr->height;
    int Cr_factor_x = Y->width / Cr->width;

    image_u8x3_t *im = image_u8x3_create(pj->width, pj->height);

    if (Cr_factor_y == 1 && Cr_factor_x == 1 && Cb_factor_y == 1 && Cb_factor_x == 1) {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x] * 65536;
                int32_t cb_val = Cb->data[y*Cb->stride + x] - 128;
                int32_t cr_val = Cr->data[y*Cr->stride + x] - 128;

                int32_t r_val = y_val +  91881 * cr_val;
                int32_t g_val = y_val + -22554 * cb_val - 46802 * cr_val;
                int32_t b_val = y_val + 116130 * cb_val;

                im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
            }
        }
    } else if (Cb_factor_y == Cr_factor_y && Cb_factor_x == Cr_factor_x) {
        for (int by = 0; by < pj->height / Cb_factor_y; by++) {
            for (int bx = 0; bx < pj->width / Cb_factor_x; bx++) {

                int32_t cb_val = Cb->data[by*Cb->stride + bx] - 128;
                int32_t cr_val = Cr->data[by*Cr->stride + bx] - 128;

                int32_t r0 =  91881 * cr_val;
                int32_t g0 = -22554 * cb_val - 46802 * cr_val;
                int32_t b0 = 116130 * cb_val;

                for (int dy = 0; dy < Cb_factor_y; dy++) {
                    int y = by*Cb_factor_y + dy;

                    for (int dx = 0; dx < Cb_factor_x; dx++) {
                        int x = bx*Cb_factor_x + dx;

                        int32_t y_val = Y->data[y*Y->stride + x] * 65536;

                        int32_t r_val = r0 + y_val;
                        int32_t g_val = g0 + y_val;
                        int32_t b_val = b0 + y_val;

                        im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                        im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                        im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
                    }
                }
            }
        }
    } else {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x];
                int32_t cb_val = Cb->data[(y / Cb_factor_y)*Cb->stride + (x / Cb_factor_x)] - 128;
                int32_t cr_val = Cr->data[(y / Cr_factor_y)*Cr->stride + (x / Cr_factor_x)] - 128;

                uint8_t r_val = clampd(y_val + 1.402 * cr_val);
                uint8_t g_val = clampd(y_val - 0.34414 * cb_val - 0.71414 * cr_val);
                uint8_t b_val = clampd(y_val + 1.772 * cb_val);

                im->buf[y*im->stride + 3*x + 0 ] = r_val;
                im->buf[y*im->stride + 3*x + 1 ] = g_val;
                im->buf[y*im->stride + 3*x + 2 ] = b_val;
            }
        }
    }

    return im;
}